

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroup::UpdateColumn
          (RowGroup *this,TransactionData transaction,DataChunk *updates,Vector *row_ids,
          vector<unsigned_long,_true> *column_path)

{
  data_ptr_t pdVar1;
  storage_t c;
  const_reference pvVar2;
  ColumnData *pCVar3;
  reference pvVar4;
  type other;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> local_50;
  DuckTransaction *local_48;
  transaction_t tStack_40;
  transaction_t local_38;
  
  pdVar1 = row_ids->data;
  pvVar2 = vector<unsigned_long,_true>::operator[](column_path,0);
  c = *pvVar2;
  pCVar3 = GetColumn(this,c);
  local_48 = transaction.transaction.ptr;
  tStack_40 = transaction.transaction_id;
  local_38 = transaction.start_time;
  pvVar4 = vector<duckdb::Vector,_true>::operator[](&updates->data,0);
  (*pCVar3->_vptr_ColumnData[0x18])
            (pCVar3,column_path,pvVar4,pdVar1,updates->count,1,local_48._0_4_,(undefined4)tStack_40,
             local_38);
  (*pCVar3->_vptr_ColumnData[0x19])(&local_50,pCVar3);
  other = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
          operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                     *)&local_50);
  pCVar3 = GetColumn(this,c);
  ColumnData::MergeStatistics(pCVar3,other);
  if ((_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
      local_50._M_t.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl != (BaseStatistics *)0x0)
  {
    BaseStatistics::~BaseStatistics
              ((BaseStatistics *)
               local_50._M_t.
               super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
               .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl);
    operator_delete((void *)local_50._M_t.
                            super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                            .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void RowGroup::UpdateColumn(TransactionData transaction, DataChunk &updates, Vector &row_ids,
                            const vector<column_t> &column_path) {
	D_ASSERT(updates.ColumnCount() == 1);
	auto ids = FlatVector::GetData<row_t>(row_ids);

	auto primary_column_idx = column_path[0];
	D_ASSERT(primary_column_idx != COLUMN_IDENTIFIER_ROW_ID);
	D_ASSERT(primary_column_idx < columns.size());
	auto &col_data = GetColumn(primary_column_idx);
	col_data.UpdateColumn(transaction, column_path, updates.data[0], ids, updates.size(), 1);
	MergeStatistics(primary_column_idx, *col_data.GetUpdateStatistics());
}